

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NodeImpl.cc
# Opt level: O0

void __thiscall avro::NodeSymbolic::printJson(NodeSymbolic *this,ostream *os,int depth)

{
  ostream *poVar1;
  ostream *in_RSI;
  size_t in_stack_00000028;
  SingleAttribute<avro::Name> *in_stack_00000030;
  
  std::operator<<(in_RSI,'\"');
  concepts::SingleAttribute<avro::Name>::get(in_stack_00000030,in_stack_00000028);
  poVar1 = operator<<((ostream *)this,(Name *)os);
  std::operator<<(poVar1,'\"');
  return;
}

Assistant:

void 
NodeSymbolic::printJson(std::ostream &os, int depth) const
{
    os << '\"' << nameAttribute_.get() << '\"';
}